

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

VkPipelineMultisampleStateCreateInfo *
vkt::pipeline::anon_unknown_0::MinSampleShadingTest::getMinSampleShadingStateParams
          (VkPipelineMultisampleStateCreateInfo *__return_storage_ptr__,
          VkSampleCountFlagBits rasterizationSamples,float minSampleShading)

{
  float minSampleShading_local;
  VkSampleCountFlagBits rasterizationSamples_local;
  
  __return_storage_ptr__->sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  __return_storage_ptr__->pNext = (void *)0x0;
  __return_storage_ptr__->flags = 0;
  __return_storage_ptr__->rasterizationSamples = rasterizationSamples;
  __return_storage_ptr__->sampleShadingEnable = 1;
  __return_storage_ptr__->minSampleShading = minSampleShading;
  __return_storage_ptr__->pSampleMask = (VkSampleMask *)0x0;
  __return_storage_ptr__->alphaToCoverageEnable = 0;
  __return_storage_ptr__->alphaToOneEnable = 0;
  return __return_storage_ptr__;
}

Assistant:

VkPipelineMultisampleStateCreateInfo MinSampleShadingTest::getMinSampleShadingStateParams (VkSampleCountFlagBits rasterizationSamples, float minSampleShading)
{
	const VkPipelineMultisampleStateCreateInfo multisampleStateParams =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		0u,															// VkPipelineMultisampleStateCreateFlags	flags;
		rasterizationSamples,										// VkSampleCountFlagBits					rasterizationSamples;
		true,														// VkBool32									sampleShadingEnable;
		minSampleShading,											// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		false,														//  VkBool32								alphaToCoverageEnable;
		false														//  VkBool32								alphaToOneEnable;
	};

	return multisampleStateParams;
}